

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::CallbackMemLocation
          (BinaryReader *this,Address *alignment_log2,Index *memidx,Address *offset,
          uint8_t *lane_val)

{
  bool bVar1;
  Result RVar2;
  uint8_t *lane_val_local;
  Address *offset_local;
  Index *memidx_local;
  Address *alignment_log2_local;
  BinaryReader *this_local;
  
  if (lane_val == (uint8_t *)0x0) {
    if (*memidx == 0) {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x3d])
                              (this->delegate_,*alignment_log2 & 0xffffffff,*offset & 0xffffffff);
      bVar1 = Succeeded(RVar2);
      if (!bVar1) {
        PrintError(this,"OnOpcodeUint32Uint32 callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x3e])
                              (this->delegate_,*alignment_log2 & 0xffffffff,(ulong)*memidx,
                               *offset & 0xffffffff);
      bVar1 = Succeeded(RVar2);
      if (!bVar1) {
        PrintError(this,"OnOpcodeUint32Uint32Uint32 callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
  }
  else if (*memidx == 0) {
    RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x3e])
                            (this->delegate_,*alignment_log2 & 0xffffffff,*offset & 0xffffffff,
                             (ulong)*lane_val);
    bVar1 = Succeeded(RVar2);
    if (!bVar1) {
      PrintError(this,"OnOpcodeUint32Uint32Uint32 callback failed");
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  else {
    RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x3f])
                            (this->delegate_,*alignment_log2 & 0xffffffff,(ulong)*memidx,
                             *offset & 0xffffffff,(ulong)*lane_val);
    bVar1 = Succeeded(RVar2);
    if (!bVar1) {
      PrintError(this,"OnOpcodeUint32Uint32Uint32Uint32 callback failed");
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::CallbackMemLocation(const Address* alignment_log2,
                                         const Index* memidx,
                                         const Address* offset,
                                         const uint8_t* lane_val) {
  if (lane_val) {
    if (*memidx) {
      CALLBACK(OnOpcodeUint32Uint32Uint32Uint32, *alignment_log2, *memidx,
               *offset, *lane_val);
    } else {
      CALLBACK(OnOpcodeUint32Uint32Uint32, *alignment_log2, *offset, *lane_val);
    }
  } else {
    if (*memidx) {
      CALLBACK(OnOpcodeUint32Uint32Uint32, *alignment_log2, *memidx, *offset);
    } else {
      CALLBACK(OnOpcodeUint32Uint32, *alignment_log2, *offset);
    }
  }

  return Result::Ok;
}